

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

RegNum __thiscall
LinearScan::Spill(LinearScan *this,Lifetime *newLifetime,RegOpnd *regOpnd,bool dontSpillCurrent,
                 bool force)

{
  undefined2 uVar1;
  code *pcVar2;
  IRType IVar3;
  bool bVar4;
  bool bVar5;
  BOOLEAN BVar6;
  RegNum RVar7;
  uint uVar8;
  undefined4 *puVar9;
  Type *ppLVar10;
  bool local_a1;
  Lifetime *local_98;
  Lifetime *spilledRange;
  uint spillCost;
  Lifetime **lifetime;
  EditingIterator iter;
  EditingIterator candidate;
  BVUnitT<unsigned_long> BStack_40;
  bool needCalleeSaved;
  BitVector intUsageBV;
  uint local_30;
  bool isFloatReg;
  uint minSpillCost;
  bool force_local;
  bool dontSpillCurrent_local;
  RegOpnd *regOpnd_local;
  Lifetime *newLifetime_local;
  LinearScan *this_local;
  
  local_30 = 0xffffffff;
  if ((newLifetime != (Lifetime *)0x0) && (regOpnd != (RegOpnd *)0x0)) {
    uVar1 = *(undefined2 *)&newLifetime->field_0x9c;
    IVar3 = IR::Opnd::GetType(&regOpnd->super_Opnd);
    local_a1 = true;
    if (IVar3 != TyFloat64) {
      local_a1 = IR::Opnd::IsSimd128(&regOpnd->super_Opnd);
    }
    if ((bool)((byte)((ushort)uVar1 >> 0xd) & 1) != local_a1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xac1,
                         "(!newLifetime || !regOpnd || newLifetime->isFloat == (regOpnd->GetType() == TyMachDouble || regOpnd->IsSimd128()))"
                         ,
                         "!newLifetime || !regOpnd || newLifetime->isFloat == (regOpnd->GetType() == TyMachDouble || regOpnd->IsSimd128())"
                        );
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
  }
  BVUnitT<unsigned_long>::BVUnitT(&stack0xffffffffffffffc0,0);
  if (newLifetime == (Lifetime *)0x0) {
    bVar4 = false;
    bVar5 = IR::Opnd::IsFloat(&regOpnd->super_Opnd);
    if ((bVar5) || (bVar5 = IR::Opnd::IsSimd128(&regOpnd->super_Opnd), bVar5)) {
      intUsageBV.word._7_1_ = 1;
    }
    else {
      intUsageBV.word._7_1_ = 0;
      BVUnitT<unsigned_long>::ClearAll(&stack0xffffffffffffffc0);
      IVar3 = IR::Opnd::GetType(&regOpnd->super_Opnd);
      BVUnitT<unsigned_long>::Set(&stack0xffffffffffffffc0,TySize[IVar3]);
    }
  }
  else {
    intUsageBV.word._7_1_ = (*(ushort *)&newLifetime->field_0x9c >> 0xd & 1) != 0;
    if (!force) {
      local_30 = GetSpillCost(this,newLifetime);
    }
    BStack_40.word = (newLifetime->intUsageBv).word;
    bVar4 = (*(ushort *)&newLifetime->field_0x9c >> 2 & 1) != 0;
  }
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::EditingIterator
            ((EditingIterator *)&iter.super_EditingIterator.last);
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&lifetime,this->activeLiveranges);
  while (bVar5 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                           ((EditingIterator *)&lifetime), bVar5) {
    ppLVar10 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)&lifetime);
    uVar8 = GetSpillCost(this,*ppLVar10);
    if (((((uVar8 < local_30) &&
          (BVar6 = BVUnitT<unsigned_long>::Test(&this->instrUseRegs,(uint)(*ppLVar10)->reg),
          BVar6 == '\0')) &&
         (((byte)((ushort)*(undefined2 *)&(*ppLVar10)->field_0x9c >> 0xd) & 1) ==
          (intUsageBV.word._7_1_ & 1))) && ((*(ushort *)&(*ppLVar10)->field_0x9c >> 7 & 1) == 0)) &&
       (((!bVar4 ||
         (BVar6 = BVUnitT<unsigned_long>::Test(&this->calleeSavedRegs,(uint)(*ppLVar10)->reg),
         BVar6 != '\0')) &&
        (bVar5 = LinearScanMD::FitRegIntSizeConstraints
                           (&this->linearScanMD,(*ppLVar10)->reg,(BitVector)BStack_40.word), bVar5))
       )) {
      iter.super_EditingIterator.last = (NodeBase *)lifetime;
      local_30 = uVar8;
    }
  }
  if ((newLifetime == (Lifetime *)0x0) &&
     (bVar4 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::IsValid
                        ((Iterator *)&iter.super_EditingIterator.last), !bVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xaf1,"(newLifetime || candidate.IsValid())",
                       "Didn\'t find anything to spill?!?");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar4 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::IsValid
                    ((Iterator *)&iter.super_EditingIterator.last);
  if (bVar4) {
    ppLVar10 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)&iter.super_EditingIterator.last);
    local_98 = *ppLVar10;
    SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
              ((EditingIterator *)&iter.super_EditingIterator.last);
    BVUnitT<unsigned_long>::Clear(&this->activeRegs,(uint)local_98->reg);
    bVar4 = Lifetime::IsInt(local_98);
    if (bVar4) {
      this->intRegUsedCount = this->intRegUsedCount - 1;
    }
    else {
      this->floatRegUsedCount = this->floatRegUsedCount - 1;
    }
  }
  else {
    local_98 = newLifetime;
    if (dontSpillCurrent) {
      return RegNOREG;
    }
  }
  RVar7 = SpillLiveRange(this,local_98,(Instr *)0x0);
  return RVar7;
}

Assistant:

RegNum
LinearScan::Spill(Lifetime *newLifetime, IR::RegOpnd *regOpnd, bool dontSpillCurrent, bool force)
{
    uint minSpillCost = (uint)-1;

    Assert(!newLifetime || !regOpnd || newLifetime->isFloat == (regOpnd->GetType() == TyMachDouble || regOpnd->IsSimd128()));
    bool isFloatReg;
    BitVector intUsageBV;
    bool needCalleeSaved;

    // For now, we just spill the lifetime with the lowest spill cost.
    if (newLifetime)
    {
        isFloatReg = newLifetime->isFloat;

        if (!force)
        {
            minSpillCost = this->GetSpillCost(newLifetime);
        }
        intUsageBV = newLifetime->intUsageBv;
        needCalleeSaved = newLifetime->isLiveAcrossUserCalls;
    }
    else
    {
        needCalleeSaved = false;
        if (regOpnd->IsFloat() || regOpnd->IsSimd128())
        {
            isFloatReg = true;
        }
        else
        {
            // Filter for int reg size constraints
            isFloatReg = false;
            intUsageBV.ClearAll();
            intUsageBV.Set(TySize[regOpnd->GetType()]);
        }
    }

    SList<Lifetime *>::EditingIterator candidate;
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, lifetime, this->activeLiveranges, iter)
    {
        uint spillCost = this->GetSpillCost(lifetime);
        if (spillCost < minSpillCost                        &&
            this->instrUseRegs.Test(lifetime->reg) == false &&
            lifetime->isFloat == isFloatReg &&
            !lifetime->cantSpill                            &&
            (!needCalleeSaved || this->calleeSavedRegs.Test(lifetime->reg)) &&
            this->linearScanMD.FitRegIntSizeConstraints(lifetime->reg, intUsageBV))
        {
            minSpillCost = spillCost;
            candidate = iter;
        }
    } NEXT_SLIST_ENTRY_EDITING;
    AssertMsg(newLifetime || candidate.IsValid(), "Didn't find anything to spill?!?");

    Lifetime * spilledRange;
    if (candidate.IsValid())
    {
        spilledRange = candidate.Data();
        candidate.RemoveCurrent();

        this->activeRegs.Clear(spilledRange->reg);
        if (spilledRange->IsInt())
        {
            this->intRegUsedCount--;
        }
        else
        {
            this->floatRegUsedCount--;
        }
    }
    else if (dontSpillCurrent)
    {
        return RegNOREG;
    }
    else
    {
        spilledRange = newLifetime;
    }

    return this->SpillLiveRange(spilledRange);
}